

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *this;
  element_type *this_00;
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  _InputArray local_218;
  allocator<char> local_1f9;
  string local_1f8 [32];
  _InputArray local_1d8;
  allocator<char> local_1b9;
  string local_1b8 [32];
  Scalar_<double> local_198;
  Point_<int> local_178;
  Point_<int> local_170;
  _InputOutputArray local_168;
  int local_14c;
  int j;
  Point pt2;
  Point pt1;
  vector<ls::lsd_segment,_std::allocator<ls::lsd_segment>_> segments;
  shared_ptr<ls::LSDDetection> lsd;
  Mat local_108 [8];
  Mat result;
  allocator<char> local_91;
  string local_90 [32];
  string local_70 [8];
  Mat img;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"/home/soumyadeep/test.jpg",&local_91)
  ;
  cv::imread(local_70,(int)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  cv::Mat::clone();
  cv::MatSize::operator()
            ((MatSize *)
             &lsd.super___shared_ptr<ls::LSDDetection,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  this = cv::operator<<((ostream *)&std::cout,
                        (Size_<int> *)
                        &lsd.super___shared_ptr<ls::LSDDetection,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  ls::createLSDDetector
            ((ls *)&segments.super__Vector_base<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(Mat *)local_70);
  this_00 = std::__shared_ptr_access<ls::LSDDetection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<ls::LSDDetection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&segments.
                           super__Vector_base<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  ls::LSDDetection::detectLines
            ((vector<ls::lsd_segment,_std::allocator<ls::lsd_segment>_> *)&pt1,this_00);
  cv::Point_<int>::Point_(&pt2);
  cv::Point_<int>::Point_((Point_<int> *)&stack0xfffffffffffffeb8);
  local_14c = 0;
  while( true ) {
    uVar1 = (ulong)local_14c;
    sVar2 = std::vector<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>::size
                      ((vector<ls::lsd_segment,_std::allocator<ls::lsd_segment>_> *)&pt1);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::vector<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>::operator[]
                       ((vector<ls::lsd_segment,_std::allocator<ls::lsd_segment>_> *)&pt1,
                        (long)local_14c);
    cv::Point_<int>::operator=(&pt2,&pvVar3->p1);
    pvVar3 = std::vector<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>::operator[]
                       ((vector<ls::lsd_segment,_std::allocator<ls::lsd_segment>_> *)&pt1,
                        (long)local_14c);
    cv::Point_<int>::operator=((Point_<int> *)&stack0xfffffffffffffeb8,&pvVar3->p2);
    cv::_InputOutputArray::_InputOutputArray(&local_168,local_108);
    cv::Point_<int>::Point_(&local_170,&pt2);
    cv::Point_<int>::Point_(&local_178,(Point_<int> *)&stack0xfffffffffffffeb8);
    cv::Scalar_<double>::Scalar_(&local_198,0.0,0.0,255.0,0.0);
    cv::line(&local_168,&local_170,&local_178,&local_198,2,0x10,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_168);
    local_14c = local_14c + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"image",&local_1b9);
  cv::_InputArray::_InputArray(&local_1d8,(Mat *)local_70);
  cv::imshow(local_1b8,&local_1d8);
  cv::_InputArray::~_InputArray(&local_1d8);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f8,"result_img",&local_1f9);
  cv::_InputArray::_InputArray(&local_218,local_108);
  cv::imshow(local_1f8,&local_218);
  cv::_InputArray::~_InputArray(&local_218);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  cv::waitKey(0);
  std::vector<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>::~vector
            ((vector<ls::lsd_segment,_std::allocator<ls::lsd_segment>_> *)&pt1);
  std::shared_ptr<ls::LSDDetection>::~shared_ptr
            ((shared_ptr<ls::LSDDetection> *)
             &segments.super__Vector_base<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  cv::Mat::~Mat(local_108);
  cv::Mat::~Mat((Mat *)local_70);
  return 0;
}

Assistant:

int main()
{
    const cv::Mat img = cv::imread("/home/soumyadeep/test.jpg");
    cv::Mat result = img.clone();
    std::cout<<img.size()<<std::endl;
    auto lsd = createLSDDetector(img);
    auto segments = lsd->detectLines();

    
    cv::Point pt1, pt2;
    for (int j = 0; j < segments.size(); ++j) {
    	pt1 = segments[j].p1;
    	pt2 = segments[j].p2;

    	cv::line(result, pt1, pt2, cv::Scalar(0, 0, 255), 2, cv::LINE_AA);
    }

    cv::imshow("image", img);
    cv::imshow("result_img", result);
    cv::waitKey();
    return 0;
}